

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O0

int fs_st_mode(string_view path)

{
  int iVar1;
  const_pointer pvVar2;
  int *piVar3;
  undefined1 local_1b8 [8];
  stat s;
  statx sx;
  undefined1 auStack_20 [4];
  int r;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  _auStack_20 = path._M_len;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  iVar1 = statx(0xffffff9c,pvVar2,0x800,2,s.__glibc_reserved + 2);
  if (iVar1 == 0) {
    path_local._M_str._4_4_ = (uint)(ushort)sx.stx_uid;
  }
  else {
    if ((iVar1 == 0) || (piVar3 = __errno_location(), *piVar3 == 0x26)) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
      iVar1 = stat(pvVar2,(stat *)local_1b8);
      if (iVar1 == 0) {
        return (int)s.st_nlink;
      }
    }
    path_local._M_str._4_4_ = 0;
  }
  return path_local._M_str._4_4_;
}

Assistant:

int
fs_st_mode(std::string_view path)
{
  int r = 0;
#if defined(STATX_MODE) && defined(USE_STATX)
// Linux Glibc only
// https://www.gnu.org/software/gnulib/manual/html_node/statx.html
// https://www.man7.org/linux/man-pages/man2/statx.2.html

  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT, STATX_MODE, &sx);
  if (r == 0) FFS_LIKELY
    return sx.stx_mode;
#endif

// https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/stat-functions
  if(r == 0 || errno == ENOSYS){
    if (struct stat s; !stat(path.data(), &s))
      return s.st_mode;
  }

  return 0;
}